

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int GetHuffBitLengthsAndCodes(VP8LHistogramSet *histogram_image,HuffmanTreeCode *huffman_codes)

{
  int iVar1;
  uint uVar2;
  VP8LHistogram **ppVVar3;
  VP8LHistogram *pVVar4;
  bool bVar5;
  void *pvVar6;
  uint8_t *buf_rle;
  HuffmanTree *huff_tree;
  long lVar7;
  ulong uVar8;
  HuffmanTreeCode *pHVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  size_t size;
  uint64_t nmemb;
  long lVar14;
  void *local_50;
  
  iVar1 = histogram_image->size;
  lVar14 = (long)iVar1;
  if (lVar14 < 1) {
    size = 0;
    iVar13 = 0;
    local_50 = WebPSafeCalloc(0,3);
    if (local_50 == (void *)0x0) {
      bVar5 = true;
      local_50 = (void *)0x0;
      buf_rle = (uint8_t *)0x0;
      huff_tree = (HuffmanTree *)0x0;
      goto LAB_001402fb;
    }
  }
  else {
    ppVVar3 = histogram_image->histograms;
    lVar7 = 0;
    nmemb = 0;
    pHVar9 = huffman_codes;
    do {
      pVVar4 = ppVVar3[lVar7];
      lVar11 = 0;
      do {
        if (lVar11 == 0) {
          iVar13 = pVVar4->palette_code_bits_;
          iVar12 = (1 << ((byte)iVar13 & 0x1f)) + 0x118;
          if (iVar13 < 1) {
            iVar12 = 0x118;
          }
        }
        else {
          iVar12 = 0x100;
          if (lVar11 == 0x60) {
            iVar12 = 0x28;
          }
        }
        *(int *)((long)&pHVar9->num_symbols + lVar11) = iVar12;
        nmemb = nmemb + (long)iVar12;
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x78);
      lVar7 = lVar7 + 1;
      pHVar9 = pHVar9 + 5;
    } while (lVar7 != lVar14);
    local_50 = WebPSafeCalloc(nmemb,3);
    if (local_50 == (void *)0x0) {
      local_50 = (void *)0x0;
      bVar5 = true;
      buf_rle = (uint8_t *)0x0;
      huff_tree = (HuffmanTree *)0x0;
      iVar13 = 0;
      goto LAB_001402fb;
    }
    size = 0;
    if (0 < iVar1) {
      pvVar6 = (void *)((long)local_50 + nmemb * 2);
      uVar8 = 1;
      if (1 < iVar1 * 5) {
        uVar8 = (ulong)(uint)(iVar1 * 5);
      }
      lVar7 = 0;
      pvVar10 = local_50;
      do {
        uVar2 = *(uint *)((long)&huffman_codes->num_symbols + lVar7);
        *(void **)((long)&huffman_codes->codes + lVar7) = pvVar10;
        *(void **)((long)&huffman_codes->code_lengths + lVar7) = pvVar6;
        pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar2 * 2);
        pvVar6 = (void *)((long)pvVar6 + (long)(int)uVar2);
        if ((int)size <= (int)uVar2) {
          size = (size_t)uVar2;
        }
        lVar7 = lVar7 + 0x18;
      } while (uVar8 * 0x18 != lVar7);
    }
  }
  buf_rle = (uint8_t *)WebPSafeMalloc(1,size);
  huff_tree = (HuffmanTree *)WebPSafeMalloc(size * 3,0x10);
  if (huff_tree == (HuffmanTree *)0x0 || buf_rle == (uint8_t *)0x0) {
    iVar13 = 0;
    bVar5 = true;
  }
  else {
    iVar13 = 1;
    if (iVar1 < 1) {
      bVar5 = false;
    }
    else {
      lVar7 = 0;
      pHVar9 = huffman_codes;
      do {
        pVVar4 = histogram_image->histograms[lVar7];
        VP8LCreateHuffmanTree(pVVar4->literal_,0xf,buf_rle,huff_tree,pHVar9);
        VP8LCreateHuffmanTree(pVVar4->red_,0xf,buf_rle,huff_tree,pHVar9 + 1);
        VP8LCreateHuffmanTree(pVVar4->blue_,0xf,buf_rle,huff_tree,pHVar9 + 2);
        VP8LCreateHuffmanTree(pVVar4->alpha_,0xf,buf_rle,huff_tree,pHVar9 + 3);
        VP8LCreateHuffmanTree(pVVar4->distance_,0xf,buf_rle,huff_tree,pHVar9 + 4);
        lVar7 = lVar7 + 1;
        pHVar9 = pHVar9 + 5;
      } while (lVar14 != lVar7);
      bVar5 = false;
    }
  }
LAB_001402fb:
  WebPSafeFree(huff_tree);
  WebPSafeFree(buf_rle);
  if (bVar5) {
    WebPSafeFree(local_50);
    memset(huffman_codes,0,lVar14 * 0x78);
  }
  return iVar13;
}

Assistant:

static int GetHuffBitLengthsAndCodes(
    const VP8LHistogramSet* const histogram_image,
    HuffmanTreeCode* const huffman_codes) {
  int i, k;
  int ok = 0;
  uint64_t total_length_size = 0;
  uint8_t* mem_buf = NULL;
  const int histogram_image_size = histogram_image->size;
  int max_num_symbols = 0;
  uint8_t* buf_rle = NULL;
  HuffmanTree* huff_tree = NULL;

  // Iterate over all histograms and get the aggregate number of codes used.
  for (i = 0; i < histogram_image_size; ++i) {
    const VP8LHistogram* const histo = histogram_image->histograms[i];
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    assert(histo != NULL);
    for (k = 0; k < 5; ++k) {
      const int num_symbols =
          (k == 0) ? VP8LHistogramNumCodes(histo->palette_code_bits_) :
          (k == 4) ? NUM_DISTANCE_CODES : 256;
      codes[k].num_symbols = num_symbols;
      total_length_size += num_symbols;
    }
  }

  // Allocate and Set Huffman codes.
  {
    uint16_t* codes;
    uint8_t* lengths;
    mem_buf = (uint8_t*)WebPSafeCalloc(total_length_size,
                                       sizeof(*lengths) + sizeof(*codes));
    if (mem_buf == NULL) goto End;

    codes = (uint16_t*)mem_buf;
    lengths = (uint8_t*)&codes[total_length_size];
    for (i = 0; i < 5 * histogram_image_size; ++i) {
      const int bit_length = huffman_codes[i].num_symbols;
      huffman_codes[i].codes = codes;
      huffman_codes[i].code_lengths = lengths;
      codes += bit_length;
      lengths += bit_length;
      if (max_num_symbols < bit_length) {
        max_num_symbols = bit_length;
      }
    }
  }

  buf_rle = (uint8_t*)WebPSafeMalloc(1ULL, max_num_symbols);
  huff_tree = (HuffmanTree*)WebPSafeMalloc(3ULL * max_num_symbols,
                                           sizeof(*huff_tree));
  if (buf_rle == NULL || huff_tree == NULL) goto End;

  // Create Huffman trees.
  for (i = 0; i < histogram_image_size; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    VP8LHistogram* const histo = histogram_image->histograms[i];
    VP8LCreateHuffmanTree(histo->literal_, 15, buf_rle, huff_tree, codes + 0);
    VP8LCreateHuffmanTree(histo->red_, 15, buf_rle, huff_tree, codes + 1);
    VP8LCreateHuffmanTree(histo->blue_, 15, buf_rle, huff_tree, codes + 2);
    VP8LCreateHuffmanTree(histo->alpha_, 15, buf_rle, huff_tree, codes + 3);
    VP8LCreateHuffmanTree(histo->distance_, 15, buf_rle, huff_tree, codes + 4);
  }
  ok = 1;
 End:
  WebPSafeFree(huff_tree);
  WebPSafeFree(buf_rle);
  if (!ok) {
    WebPSafeFree(mem_buf);
    memset(huffman_codes, 0, 5 * histogram_image_size * sizeof(*huffman_codes));
  }
  return ok;
}